

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseAttributeType(xmlParserCtxtPtr ctxt,xmlEnumerationPtr *tree)

{
  xmlEnumerationPtr *tree_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if (((*ctxt->input->cur == 'C') && (ctxt->input->cur[1] == 'D')) &&
     ((ctxt->input->cur[2] == 'A' && ((ctxt->input->cur[3] == 'T' && (ctxt->input->cur[4] == 'A'))))
     )) {
    ctxt->input->cur = ctxt->input->cur + 5;
    ctxt->input->col = ctxt->input->col + 5;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 1;
  }
  else if ((*ctxt->input->cur == 'I') &&
          ((((ctxt->input->cur[1] == 'D' && (ctxt->input->cur[2] == 'R')) &&
            (ctxt->input->cur[3] == 'E')) &&
           ((ctxt->input->cur[4] == 'F' && (ctxt->input->cur[5] == 'S')))))) {
    ctxt->input->cur = ctxt->input->cur + 6;
    ctxt->input->col = ctxt->input->col + 6;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 4;
  }
  else if ((((*ctxt->input->cur == 'I') &&
            ((ctxt->input->cur[1] == 'D' && (ctxt->input->cur[2] == 'R')))) &&
           (ctxt->input->cur[3] == 'E')) && (ctxt->input->cur[4] == 'F')) {
    ctxt->input->cur = ctxt->input->cur + 5;
    ctxt->input->col = ctxt->input->col + 5;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 3;
  }
  else if ((*ctxt->input->cur == 'I') && (ctxt->input->cur[1] == 'D')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 2;
  }
  else if (((*ctxt->input->cur == 'E') &&
           (((ctxt->input->cur[1] == 'N' && (ctxt->input->cur[2] == 'T')) &&
            (ctxt->input->cur[3] == 'I')))) &&
          ((ctxt->input->cur[4] == 'T' && (ctxt->input->cur[5] == 'Y')))) {
    ctxt->input->cur = ctxt->input->cur + 6;
    ctxt->input->col = ctxt->input->col + 6;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 5;
  }
  else if (((*ctxt->input->cur == 'E') &&
           (((ctxt->input->cur[1] == 'N' && (ctxt->input->cur[2] == 'T')) &&
            ((ctxt->input->cur[3] == 'I' &&
             (((ctxt->input->cur[4] == 'T' && (ctxt->input->cur[5] == 'I')) &&
              (ctxt->input->cur[6] == 'E')))))))) && (ctxt->input->cur[7] == 'S')) {
    ctxt->input->cur = ctxt->input->cur + 8;
    ctxt->input->col = ctxt->input->col + 8;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 6;
  }
  else if ((((*ctxt->input->cur == 'N') && (ctxt->input->cur[1] == 'M')) &&
           ((ctxt->input->cur[2] == 'T' &&
            ((ctxt->input->cur[3] == 'O' && (ctxt->input->cur[4] == 'K')))))) &&
          ((ctxt->input->cur[5] == 'E' &&
           ((ctxt->input->cur[6] == 'N' && (ctxt->input->cur[7] == 'S')))))) {
    ctxt->input->cur = ctxt->input->cur + 8;
    ctxt->input->col = ctxt->input->col + 8;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 8;
  }
  else if (((*ctxt->input->cur == 'N') &&
           ((((ctxt->input->cur[1] == 'M' && (ctxt->input->cur[2] == 'T')) &&
             (ctxt->input->cur[3] == 'O')) &&
            ((ctxt->input->cur[4] == 'K' && (ctxt->input->cur[5] == 'E')))))) &&
          (ctxt->input->cur[6] == 'N')) {
    ctxt->input->cur = ctxt->input->cur + 7;
    ctxt->input->col = ctxt->input->col + 7;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    ctxt_local._4_4_ = 7;
  }
  else {
    ctxt_local._4_4_ = xmlParseEnumeratedType(ctxt,tree);
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseAttributeType(xmlParserCtxtPtr ctxt, xmlEnumerationPtr *tree) {
    SHRINK;
    if (CMP5(CUR_PTR, 'C', 'D', 'A', 'T', 'A')) {
	SKIP(5);
	return(XML_ATTRIBUTE_CDATA);
     } else if (CMP6(CUR_PTR, 'I', 'D', 'R', 'E', 'F', 'S')) {
	SKIP(6);
	return(XML_ATTRIBUTE_IDREFS);
     } else if (CMP5(CUR_PTR, 'I', 'D', 'R', 'E', 'F')) {
	SKIP(5);
	return(XML_ATTRIBUTE_IDREF);
     } else if ((RAW == 'I') && (NXT(1) == 'D')) {
        SKIP(2);
	return(XML_ATTRIBUTE_ID);
     } else if (CMP6(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'Y')) {
	SKIP(6);
	return(XML_ATTRIBUTE_ENTITY);
     } else if (CMP8(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'I', 'E', 'S')) {
	SKIP(8);
	return(XML_ATTRIBUTE_ENTITIES);
     } else if (CMP8(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N', 'S')) {
	SKIP(8);
	return(XML_ATTRIBUTE_NMTOKENS);
     } else if (CMP7(CUR_PTR, 'N', 'M', 'T', 'O', 'K', 'E', 'N')) {
	SKIP(7);
	return(XML_ATTRIBUTE_NMTOKEN);
     }
     return(xmlParseEnumeratedType(ctxt, tree));
}